

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void __thiscall Args::HelpPrinter::~HelpPrinter(HelpPrinter *this)

{
  HelpPrinterIface *in_RDI;
  
  in_RDI->_vptr_HelpPrinterIface = (_func_int **)&PTR__HelpPrinter_001bd1f0;
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  HelpPrinterIface::~HelpPrinterIface(in_RDI);
  return;
}

Assistant:

inline
HelpPrinter::~HelpPrinter()
{
}